

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcICheck.c
# Opt level: O2

void Bmc_PerformICheck(Gia_Man_t *p,int nFramesMax,int nTimeOut,int fEmpty,int fVerbose)

{
  uint uVar1;
  Cnf_Dat_t *pCnf;
  int *piVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  abctime aVar8;
  Gia_Man_t *pGVar9;
  Gia_Man_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  sat_solver *s;
  ulong uVar10;
  abctime aVar11;
  abctime time;
  int iVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  uint local_78;
  
  aVar8 = Abc_Clock();
  if (nFramesMax < 1) {
    __assert_fail("nFramesMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                  ,0xce,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
  }
  uVar1 = p->nRegs;
  if ((int)uVar1 < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                  ,0xcf,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
  }
  if (fVerbose != 0) {
    pcVar14 = p->pName;
    uVar4 = Gia_ManAndNum(p);
    printf("Solving M-inductiveness for design %s with %d AND nodes and %d flip-flops:\n",pcVar14,
           (ulong)uVar4,(ulong)uVar1);
  }
  pGVar9 = Gia_ManDup(p);
  uVar15 = 0;
  p_00 = Gia_ManMiter(p,pGVar9,0,1,1,0,0);
  Gia_ManStop(pGVar9);
  if (p_00->vCos->nSize - p_00->nRegs != (p->vCos->nSize - p->nRegs) * 2) {
    __assert_fail("Gia_ManPoNum(pMiter) == 2 * Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                  ,0xd9,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
  }
  if (p_00->nRegs != p->nRegs * 2) {
    __assert_fail("Gia_ManRegNum(pMiter) == 2 * Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                  ,0xda,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
  }
  pGVar9 = Jf_ManDeriveCnf(p_00,0);
  Gia_ManStop(p_00);
  pCnf = (Cnf_Dat_t *)pGVar9->pData;
  pGVar9->pData = (void *)0x0;
  p_01 = Vec_IntAlloc(p->vCos->nSize);
  for (iVar12 = 0; iVar12 < p->nRegs; iVar12 = iVar12 + 1) {
    iVar5 = Abc_Var2Lit(iVar12,fEmpty);
    Vec_IntPush(p_01,iVar5);
  }
  uVar1 = p_01->nSize;
  local_78 = uVar1;
  if (fEmpty != 0) {
    local_78 = 0;
  }
  p_02 = Vec_IntAlloc(uVar1);
  uVar13 = 0;
  if (0 < (int)uVar1) {
    uVar13 = (ulong)uVar1;
  }
  while( true ) {
    s = Bmc_DeriveSolver(p,pGVar9,pCnf,nFramesMax,nTimeOut,(int)uVar15);
    uVar15 = 0;
    iVar12 = sat_solver_solve(s,p_01->pArray,p_01->pArray + (int)uVar1,0,0,0,0);
    if (iVar12 != -1) break;
    piVar2 = (s->conf_final).ptr;
    uVar4 = (s->conf_final).size;
    Vec_IntGrow(p_02,uVar1);
    for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
      p_02->pArray[uVar10] = 0;
    }
    p_02->nSize = uVar1;
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
      iVar12 = Abc_Lit2Var(piVar2[uVar10]);
      Vec_IntWriteEntry(p_02,iVar12,1);
    }
    bVar3 = false;
    for (iVar12 = 0; (int)uVar13 != iVar12; iVar12 = iVar12 + 1) {
      iVar5 = Vec_IntEntry(p_01,iVar12);
      iVar6 = Abc_Lit2Var(iVar5);
      if (iVar12 != iVar6) {
        __assert_fail("i == Abc_Lit2Var(Lit)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                      ,0x109,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
      }
      iVar6 = Abc_LitIsCompl(iVar5);
      if ((iVar6 == 0) && (iVar6 = Vec_IntEntry(p_02,iVar12), iVar6 == 0)) {
        iVar5 = Abc_LitNot(iVar5);
        Vec_IntWriteEntry(p_01,iVar12,iVar5);
        local_78 = local_78 - 1;
        bVar3 = true;
      }
    }
    if (fVerbose != 0) {
      iVar6 = Gia_ManAndNum(pGVar9);
      iVar12 = p->vCos->nSize;
      iVar5 = p->nRegs;
      iVar7 = sat_solver_nvars(s);
      uVar4 = sat_solver_nconflicts(s);
      uVar15 = (ulong)local_78;
      pcVar14 = (char *)(ulong)(uint)nFramesMax;
      printf("M =%4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
             ((double)(int)local_78 * 100.0) / (double)p->nRegs,(char *)(ulong)(uint)nFramesMax,
             (ulong)(uint)(iVar6 * (nFramesMax + 1)),(ulong)(uint)(iVar12 + iVar5 + iVar7),
             (ulong)uVar4);
      aVar11 = Abc_Clock();
      Abc_PrintTime((int)aVar11 - (int)aVar8,pcVar14,time);
    }
    sat_solver_delete(s);
    if ((fEmpty != 0) || (!bVar3)) goto LAB_0049b383;
  }
  if (iVar12 == 1) {
    puts("The problem is satisfiable (the current set is not M-inductive).");
  }
  else {
    if (iVar12 != 0) {
      __assert_fail("status == l_False",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                    ,0xfe,"void Bmc_PerformICheck(Gia_Man_t *, int, int, int, int)");
    }
    printf("Timeout reached after %d seconds.\n",(ulong)(uint)nTimeOut);
  }
LAB_0049b383:
  Cnf_DataFree(pCnf);
  Gia_ManStop(pGVar9);
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  return;
}

Assistant:

void Bmc_PerformICheck( Gia_Man_t * p, int nFramesMax, int nTimeOut, int fEmpty, int fVerbose )
{
    int fUseOldCnf = 0;
    Gia_Man_t * pMiter, * pTemp;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Vec_Int_t * vLits, * vUsed;
    int i, status, Lit;
    int nLitsUsed, nLits, * pLits;
    abctime clkStart = Abc_Clock();
    assert( nFramesMax > 0 );
    assert( Gia_ManRegNum(p) > 0 );

    if ( fVerbose )
    printf( "Solving M-inductiveness for design %s with %d AND nodes and %d flip-flops:\n",
        Gia_ManName(p), Gia_ManAndNum(p), Gia_ManRegNum(p) );

    // create miter
    pTemp = Gia_ManDup( p );
    pMiter = Gia_ManMiter( p, pTemp, 0, 1, 1, 0, 0 );
    Gia_ManStop( pTemp );
    assert( Gia_ManPoNum(pMiter)  == 2 * Gia_ManPoNum(p) );
    assert( Gia_ManRegNum(pMiter) == 2 * Gia_ManRegNum(p) );
    // derive CNF
    if ( fUseOldCnf )
        pCnf = Cnf_DeriveGiaRemapped( pMiter );
    else
    {
        pMiter = Jf_ManDeriveCnf( pTemp = pMiter, 0 );
        Gia_ManStop( pTemp );
        pCnf = (Cnf_Dat_t *)pMiter->pData; pMiter->pData = NULL;
    }

    // collect positive literals
    vLits = Vec_IntAlloc( Gia_ManCoNum(p) );
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        Vec_IntPush( vLits, Abc_Var2Lit(i, fEmpty) );

    // iteratively compute a minimal M-inductive set of next-state functions
    nLitsUsed = fEmpty ? 0 : Vec_IntSize(vLits);
    vUsed = Vec_IntAlloc( Vec_IntSize(vLits) );
    while ( 1 )
    {
        int fChanges = 0;
        // derive SAT solver        
        pSat = Bmc_DeriveSolver( p, pMiter, pCnf, nFramesMax, nTimeOut, fVerbose );
//        sat_solver_bookmark( pSat );
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_Undef )
        {
            printf( "Timeout reached after %d seconds.\n", nTimeOut );
            break;
        }
        if ( status == l_True )
        {
            printf( "The problem is satisfiable (the current set is not M-inductive).\n" );
            break;
        }
        assert( status == l_False );
        // call analize_final
        nLits = sat_solver_final( pSat, &pLits );
        // mark used literals
        Vec_IntFill( vUsed, Vec_IntSize(vLits), 0 );
        for ( i = 0; i < nLits; i++ )
            Vec_IntWriteEntry( vUsed, Abc_Lit2Var(pLits[i]), 1 );

        // check if there are any positive unused
        Vec_IntForEachEntry( vLits, Lit, i )
        {
            assert( i == Abc_Lit2Var(Lit) );
            if ( Abc_LitIsCompl(Lit) )
                continue;
            if ( Vec_IntEntry(vUsed, i) )
                continue;
            // positive literal became unused
            Vec_IntWriteEntry( vLits, i, Abc_LitNot(Lit) );
            nLitsUsed--;
            fChanges = 1;
        }
        // report the results
        if ( fVerbose )
        printf( "M =%4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
            nFramesMax, (nFramesMax+1) * Gia_ManAndNum(pMiter), 
            Gia_ManRegNum(p) + Gia_ManCoNum(p) + sat_solver_nvars(pSat), 
            sat_solver_nconflicts(pSat), nLitsUsed, 100.0 * nLitsUsed / Gia_ManRegNum(p) );
        if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
        // count the number of negative literals
        sat_solver_delete( pSat );
        if ( !fChanges || fEmpty )
            break;
//        break;
//        sat_solver_rollback( pSat );
    }
    Cnf_DataFree( pCnf );
    Gia_ManStop( pMiter );
    Vec_IntFree( vLits );
    Vec_IntFree( vUsed );
}